

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O3

C_Node * equality(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  C_Token *tok_00;
  _Bool _Var1;
  C_Node *pCVar2;
  C_Node *pCVar3;
  C_Node *pCVar4;
  C_NodeKind CVar5;
  C_Token *local_40;
  C_Token **local_38;
  
  local_40 = tok;
  local_38 = rest;
  pCVar2 = relational(parser,&local_40,tok);
  do {
    tok_00 = local_40;
    _Var1 = C_equal(local_40,"==");
    CVar5 = ND_EQ;
    if (!_Var1) {
      _Var1 = C_equal(tok_00,"!=");
      CVar5 = ND_NE;
      if (!_Var1) {
        *local_38 = tok_00;
        return pCVar2;
      }
    }
    pCVar3 = relational(parser,&local_40,tok_00->next);
    pCVar4 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar4->kind = CVar5;
    pCVar4->tok = tok_00;
    pCVar4->lhs = pCVar2;
    pCVar4->rhs = pCVar3;
    pCVar2 = pCVar4;
  } while( true );
}

Assistant:

static C_Node *equality(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Node *node = relational(parser, &tok, tok);

  for (;;) {
    C_Token *start = tok;

    if (C_equal(tok, "==")) {
      node = new_binary(parser, ND_EQ, node, relational(parser, &tok, tok->next), start);
      continue;
    }

    if (C_equal(tok, "!=")) {
      node = new_binary(parser, ND_NE, node, relational(parser, &tok, tok->next), start);
      continue;
    }

    *rest = tok;
    return node;
  }
}